

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O1

void __thiscall
notch::io::PlainTextNetworkReader::read_layer_config
          (PlainTextNetworkReader *this,istream *in,size_t *inputDim,size_t *outputDim,
          string *activationTag,Array *weights,Array *bias)

{
  int iVar1;
  istream *piVar2;
  float *pfVar3;
  runtime_error *prVar4;
  size_t sVar5;
  string tag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 7) == 0) {
    do {
      read_tag_abi_cxx11_(&local_70,this,in);
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) != 0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"unexpected end of layer record");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = std::__cxx11::string::compare((char *)&local_90);
      if (iVar1 == 0) {
        piVar2 = std::ws<char,std::char_traits<char>>(in);
LAB_0017d0ca:
        piVar2 = std::istream::_M_extract<unsigned_long>((ulong *)piVar2);
        std::ws<char,std::char_traits<char>>(piVar2);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_90);
        if (iVar1 == 0) {
          piVar2 = std::ws<char,std::char_traits<char>>(in);
          goto LAB_0017d0ca;
        }
        iVar1 = std::__cxx11::string::compare((char *)&local_90);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)&local_90);
          if (iVar1 != 0) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_70,"unsupported layer attribute: ",&local_90);
            std::runtime_error::runtime_error(prVar4,(string *)&local_70);
            __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          sVar5 = *inputDim * *outputDim;
          if (weights->_M_size != sVar5) {
            operator_delete(weights->_M_data);
            weights->_M_size = sVar5;
            pfVar3 = (float *)operator_new(sVar5 * 4);
            weights->_M_data = pfVar3;
          }
          if (sVar5 != 0) {
            memset(weights->_M_data,0,sVar5 * 4);
          }
          sVar5 = *outputDim;
          if (bias->_M_size != sVar5) {
            operator_delete(bias->_M_data);
            bias->_M_size = sVar5;
            pfVar3 = (float *)operator_new(sVar5 * 4);
            bias->_M_data = pfVar3;
          }
          if (sVar5 != 0) {
            memset(bias->_M_data,0,sVar5 << 2);
          }
          read_weights(this,in,weights,bias);
          break;
        }
        read_value<std::__cxx11::string>(&local_50,this,in,activationTag);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
    } while (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 7) == 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void read_layer_config(std::istream &in,
                           size_t &inputDim, size_t &outputDim,
                           std::string &activationTag,
                           Array &weights, Array &bias) {
        std::string tag;
        while (in && !in.eof()) {
            tag = read_tag(in);
            if (!in) { // trying to read past EOF or other errors
                throw std::runtime_error("unexpected end of layer record");
            }
            if (tag == "inputs:") {
                read_value<size_t>(in, inputDim);
            } else if (tag == "outputs:") {
                read_value<size_t>(in, outputDim);
            } else if (tag == "activation:") {
                read_value<std::string>(in, activationTag);
            } else if (tag == "bias_and_weights:") {
                weights.resize(inputDim * outputDim, 0.0);
                bias.resize(outputDim, 0.0);
                read_weights(in, weights, bias);
                break; // this should be the last layer attribute
            } else {
                throw std::runtime_error("unsupported layer attribute: " + tag);
            }
        };
    }